

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_test_registry.hpp
# Opt level: O0

void __thiscall
Catch::
TestInvokerAsMethod<(anonymous_namespace)::CATCH2_INTERNAL_TEMPLATE_TEST_102<slang::SmallVector<(anonymous_namespace)::Constructable,_4UL>_>_>
::invoke(TestInvokerAsMethod<(anonymous_namespace)::CATCH2_INTERNAL_TEMPLATE_TEST_102<slang::SmallVector<(anonymous_namespace)::Constructable,_4UL>_>_>
         *this)

{
  long *plVar1;
  long in_RDI;
  CATCH2_INTERNAL_TEMPLATE_TEST_102<slang::SmallVector<(anonymous_namespace)::Constructable,_4UL>_>
  obj;
  code *local_a8;
  long local_78 [15];
  
  anon_unknown.dwarf_70180c::
  CATCH2_INTERNAL_TEMPLATE_TEST_102<slang::SmallVector<(anonymous_namespace)::Constructable,_4UL>_>
  ::CATCH2_INTERNAL_TEMPLATE_TEST_102
            ((CATCH2_INTERNAL_TEMPLATE_TEST_102<slang::SmallVector<(anonymous_namespace)::Constructable,_4UL>_>
              *)0x8e2b36);
  local_a8 = *(code **)(in_RDI + 8);
  plVar1 = (long *)((long)local_78 + *(long *)(in_RDI + 0x10));
  if (((ulong)local_a8 & 1) != 0) {
    local_a8 = *(code **)(local_a8 + *plVar1 + -1);
  }
  (*local_a8)(plVar1);
  anon_unknown.dwarf_70180c::
  CATCH2_INTERNAL_TEMPLATE_TEST_102<slang::SmallVector<(anonymous_namespace)::Constructable,_4UL>_>
  ::~CATCH2_INTERNAL_TEMPLATE_TEST_102
            ((CATCH2_INTERNAL_TEMPLATE_TEST_102<slang::SmallVector<(anonymous_namespace)::Constructable,_4UL>_>
              *)0x8e2b9a);
  return;
}

Assistant:

void invoke() const override {
        C obj;
        (obj.*m_testAsMethod)();
    }